

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void * __thiscall CTcPrsMem::alloc(CTcPrsMem *this,size_t siz)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  CTcPrsMem *in_RSI;
  long in_RDI;
  size_t space_used;
  char *ret;
  
  if ((*(CTcPrsMem **)(in_RDI + 0x18) < in_RSI) &&
     (alloc_block(in_RSI), *(CTcPrsMem **)(in_RDI + 0x18) < in_RSI)) {
    CTcTokenizer::throw_internal_error(0x2afb,in_RSI);
  }
  pvVar1 = *(void **)(in_RDI + 0x10);
  pvVar2 = osrndpt((void *)((long)&in_RSI->head_ + *(long *)(in_RDI + 0x10)));
  *(void **)(in_RDI + 0x10) = pvVar2;
  uVar3 = *(long *)(in_RDI + 0x10) - (long)pvVar1;
  if (*(ulong *)(in_RDI + 0x18) < uVar3) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  else {
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - uVar3;
  }
  return pvVar1;
}

Assistant:

void *CTcPrsMem::alloc(size_t siz)
{
    char *ret;
    size_t space_used;

    /* if there's not enough space available, allocate a new block */
    if (siz > rem_)
    {
        /* allocate a new block */
        alloc_block();

        /* 
         *   if there's still not enough room, the request must exceed the
         *   largest block we can allocate 
         */
        if (siz > rem_)
            G_tok->throw_internal_error(TCERR_PRS_BLK_TOO_BIG, (ulong)siz);
    }

    /* return the free pointer */
    ret = free_ptr_;

    /* advance the free pointer past the space, rounding for alignment */
    free_ptr_ = (char *)osrndpt((unsigned char *)free_ptr_ + siz);

    /* deduct the amount of space we consumed from the available space */
    space_used = free_ptr_ - ret;
    if (space_used > rem_)
        rem_ = 0;
    else
        rem_ -= space_used;

    /* return the allocated space */
    return ret;
}